

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O0

string * pbrt::detail::
         DispatchCPU<pbrt::BxDF::ToString[abi:cxx11]()const::__0&,std::__cxx11::string,pbrt::DiffuseTransmissionBxDF,pbrt::DiffuseBxDF,pbrt::CoatedDiffuseBxDF,pbrt::CoatedConductorBxDF,pbrt::DielectricBxDF,pbrt::ThinDielectricBxDF,pbrt::HairBxDF,pbrt::MeasuredBxDF,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF,void>
                   (anon_class_1_0_00000001 *func,void *ptr,int index)

{
  undefined4 in_ECX;
  anon_class_1_0_00000001 *in_RDX;
  string *in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  
  switch(in_ECX) {
  case 0:
    const::$_0::operator()((anon_class_1_0_00000001 *)in_RDI,(DiffuseTransmissionBxDF *)in_RDI);
    break;
  case 1:
    const::$_0::operator()((anon_class_1_0_00000001 *)in_RDI,(DiffuseBxDF *)in_RDI);
    break;
  case 2:
    const::$_0::operator()((anon_class_1_0_00000001 *)in_RDI,(CoatedDiffuseBxDF *)in_RDI);
    break;
  case 3:
    const::$_0::operator()((anon_class_1_0_00000001 *)in_RDI,(CoatedConductorBxDF *)in_RDI);
    break;
  case 4:
    const::$_0::operator()((anon_class_1_0_00000001 *)in_RDI,(DielectricBxDF *)in_RDI);
    break;
  case 5:
    const::$_0::operator()((anon_class_1_0_00000001 *)in_RDI,(ThinDielectricBxDF *)in_RDI);
    break;
  case 6:
    const::$_0::operator()((anon_class_1_0_00000001 *)in_RDI,(HairBxDF *)in_RDI);
    break;
  case 7:
    const::$_0::operator()((anon_class_1_0_00000001 *)in_RDI,(MeasuredBxDF *)in_RDI);
    break;
  default:
    DispatchCPU<pbrt::BxDF::ToString[abi:cxx11]()const::__0&,std::__cxx11::string,pbrt::ConductorBxDF,pbrt::NormalizedFresnelBxDF>
              (in_RDX,(void *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
               (int)((ulong)in_RDI >> 0x20));
  }
  return in_RDI;
}

Assistant:

auto DispatchCPU(F &&func, const void *ptr, int index) {
    DCHECK_GE(index, 0);

    switch (index) {
    case 0:
        return func((const T0 *)ptr);
    case 1:
        return func((const T1 *)ptr);
    case 2:
        return func((const T2 *)ptr);
    case 3:
        return func((const T3 *)ptr);
    case 4:
        return func((const T4 *)ptr);
    case 5:
        return func((const T5 *)ptr);
    case 6:
        return func((const T6 *)ptr);
    case 7:
        return func((const T7 *)ptr);
    default:
        return DispatchCPU<F, R, Ts...>(func, ptr, index - 8);
    }
}